

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O3

attr_list internal_create_attr_list(int iattr_count,int oattr_count)

{
  attr_list p_Var1;
  attr_p paVar2;
  int_attr_struct *piVar3;
  size_t __size;
  
  p_Var1 = (attr_list)calloc(1,0x18);
  p_Var1->ref_count = 1;
  if (oattr_count == 0) {
    paVar2 = (attr_p)0x0;
  }
  else {
    paVar2 = (attr_p)calloc(1,(ulong)(uint)oattr_count * 0x18);
  }
  (p_Var1->l).list.attributes = paVar2;
  if (iattr_count == 0) {
    __size = 0x10;
  }
  else {
    __size = (ulong)(iattr_count - 1) * 8 + 0xc;
  }
  piVar3 = (int_attr_struct *)calloc(1,__size);
  (p_Var1->l).list.iattrs = piVar3;
  piVar3->other_attr_count = (uchar)oattr_count;
  piVar3->int_attr_count = (uchar)iattr_count;
  if (words_bigendian == '\0') {
    words_bigendian = '\x01';
  }
  piVar3->byte_order = '\0';
  piVar3->junk = '\0';
  return p_Var1;
}

Assistant:

static attr_list
internal_create_attr_list(int iattr_count, int oattr_count)
{
    attr_list list = calloc(1, sizeof(attr_list_struct));

    list->list_of_lists = 0;
    list->ref_count = 1;
    if (oattr_count == 0) {
	list->l.list.attributes = NULL;
    } else {
        list->l.list.attributes = calloc(1,  oattr_count * sizeof(attr));
    }
    if (iattr_count == 0) {
	/* adding 4 here so that we can pad the send structure up to 8 */
        list->l.list.iattrs = calloc(1, sizeof(struct int_attr_struct) + 4);
    } else {
        list->l.list.iattrs = calloc(1, sizeof(struct int_attr_struct) +
				     (iattr_count -1) * sizeof(int_attr));
    }
    list->l.list.iattrs->other_attr_count = oattr_count;
    list->l.list.iattrs->int_attr_count = iattr_count;
    list->l.list.iattrs->byte_order = WORDS_BIGENDIAN;
    list->l.list.iattrs->junk = 0;
    return list;  
}